

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O2

uint64_t helper_pacga_aarch64(CPUARMState_conflict *env,uint64_t x,uint64_t y)

{
  int el;
  uint64_t uVar1;
  uintptr_t unaff_retaddr;
  
  el = arm_current_el(env);
  pauth_check_trap(env,el,unaff_retaddr);
  uVar1 = pauth_computepac(x,y,(env->keys).apga);
  return uVar1 & 0xffffffff00000000;
}

Assistant:

uint64_t HELPER(pacga)(CPUARMState *env, uint64_t x, uint64_t y)
{
    uint64_t pac;

    pauth_check_trap(env, arm_current_el(env), GETPC());
    pac = pauth_computepac(x, y, env->keys.apga);

    return pac & 0xffffffff00000000ull;
}